

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall
ON_Matrix::BackSolve(ON_Matrix *this,double zero_tolerance,int Bsize,ON_3dPoint *B,ON_3dPoint *X)

{
  ON_3dPoint *pOVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  ON_3dPoint local_a8;
  ON_3dVector local_90;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  double **local_48;
  double **this_m;
  int j;
  int i;
  ON_3dPoint *X_local;
  ON_3dPoint *B_local;
  double dStack_20;
  int Bsize_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  if (this->m_row_count < this->m_col_count) {
    this_local._7_1_ = false;
  }
  else if ((Bsize < this->m_col_count) || (this->m_row_count < Bsize)) {
    this_local._7_1_ = false;
  }
  else {
    _j = X;
    X_local = B;
    B_local._4_4_ = Bsize;
    dStack_20 = zero_tolerance;
    zero_tolerance_local = (double)this;
    for (this_m._4_4_ = this->m_col_count; this_m._4_4_ < B_local._4_4_;
        this_m._4_4_ = this_m._4_4_ + 1) {
      dVar3 = ON_3dPoint::MaximumCoordinate(X_local + this_m._4_4_);
      if (dStack_20 < dVar3) {
        return false;
      }
    }
    local_48 = ThisM(this);
    if (_j == X_local) {
      for (this_m._4_4_ = this->m_col_count + -2; this_m._0_4_ = this_m._4_4_, -1 < this_m._4_4_;
          this_m._4_4_ = this_m._4_4_ + -1) {
        while (this_m._0_4_ = (int)this_m + 1, (int)this_m < this->m_col_count) {
          ::operator*(&local_a8,local_48[this_m._4_4_][(int)this_m],_j + (int)this_m);
          ON_3dVector::ON_3dVector(&local_90,&local_a8);
          ON_3dPoint::operator-=(_j + this_m._4_4_,&local_90);
        }
      }
    }
    else {
      pOVar2 = X_local + (this->m_col_count + -1);
      pOVar1 = _j + (this->m_col_count + -1);
      pOVar1->x = pOVar2->x;
      pOVar1->y = pOVar2->y;
      pOVar1->z = pOVar2->z;
      for (this_m._4_4_ = this->m_col_count + -2; -1 < this_m._4_4_;
          this_m._4_4_ = this_m._4_4_ + -1) {
        pOVar2 = X_local + this_m._4_4_;
        pOVar1 = _j + this_m._4_4_;
        pOVar1->x = pOVar2->x;
        pOVar1->y = pOVar2->y;
        pOVar1->z = pOVar2->z;
        this_m._0_4_ = this_m._4_4_;
        while (this_m._0_4_ = (int)this_m + 1, (int)this_m < this->m_col_count) {
          ::operator*(&local_78,local_48[this_m._4_4_][(int)this_m],_j + (int)this_m);
          ON_3dVector::ON_3dVector(&local_60,&local_78);
          ON_3dPoint::operator-=(_j + this_m._4_4_,&local_60);
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int Bsize,
    const ON_3dPoint* B,
    ON_3dPoint* X
    ) const
{
  int i, j;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) {
    if ( B[i].MaximumCoordinate() > zero_tolerance )
      return false; // over determined
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( X != B )
  {
    X[m_col_count-1] = B[m_col_count-1];
    for ( i = m_col_count-2; i >= 0; i-- ) {
      X[i] = B[i];
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }

  return true;
}